

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Terminal.c
# Opt level: O1

void cmsysTerminal_cfprintf(int color,FILE *stream,char *format,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  undefined8 in_RCX;
  char *__s2;
  undefined8 in_R8;
  undefined8 in_R9;
  char **ppcVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list var_args;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  pcVar2 = getenv("EMACS");
  if ((pcVar2 == (char *)0x0) || (*pcVar2 != 't')) {
    if (((uint)color >> 0xb & 1) == 0) {
      pcVar2 = getenv("TERM");
      if (pcVar2 == (char *)0x0) {
        ppcVar3 = (char **)0x0;
      }
      else {
        ppcVar3 = kwsysTerminalVT100Names;
        __s2 = "Eterm";
        do {
          iVar1 = strcmp(pcVar2,__s2);
          if (iVar1 == 0) goto LAB_0042c6b6;
          __s2 = ppcVar3[1];
          ppcVar3 = ppcVar3 + 1;
        } while (__s2 != (char *)0x0);
        ppcVar3 = kwsysTerminalVT100Names + 0x32;
      }
LAB_0042c6b6:
      if ((ppcVar3 == (char **)0x0) || (*ppcVar3 == (char *)0x0)) goto LAB_0042c72a;
    }
    iVar1 = fileno((FILE *)stream);
    iVar1 = isatty(iVar1);
    if (iVar1 != 0) {
      kwsysTerminalSetVT100Color(stream,color);
      local_f8 = local_e8;
      local_100 = &var_args[0].overflow_arg_area;
      local_108 = 0x3000000018;
      vfprintf((FILE *)stream,format,&local_108);
      fwrite("\x1b[0m",4,1,(FILE *)stream);
      return;
    }
  }
LAB_0042c72a:
  local_f8 = local_e8;
  local_100 = &var_args[0].overflow_arg_area;
  local_108 = 0x3000000018;
  vfprintf((FILE *)stream,format,&local_108);
  return;
}

Assistant:

void kwsysTerminal_cfprintf(int color, FILE* stream, const char* format, ...)
{
  /* Setup the stream with the given color if possible.  */
  int pipeIsConsole = 0;
  int pipeIsVT100 = 0;
  int default_vt100 = color & kwsysTerminal_Color_AssumeVT100;
  int default_tty = color & kwsysTerminal_Color_AssumeTTY;
#if defined(KWSYS_TERMINAL_SUPPORT_CONSOLE)
  CONSOLE_SCREEN_BUFFER_INFO hOutInfo;
  HANDLE hOut = kwsysTerminalGetStreamHandle(stream);
  if(GetConsoleScreenBufferInfo(hOut, &hOutInfo))
    {
    pipeIsConsole = 1;
    kwsysTerminalSetConsoleColor(hOut, &hOutInfo, stream, color);
    }
#endif
  if(!pipeIsConsole && kwsysTerminalStreamIsVT100(stream,
                                                  default_vt100, default_tty))
    {
    pipeIsVT100 = 1;
    kwsysTerminalSetVT100Color(stream, color);
    }

  /* Format the text into the stream.  */
  {
  va_list var_args;
  va_start(var_args, format);
  vfprintf(stream, format, var_args);
  va_end(var_args);
  }

  /* Restore the normal color state for the stream.  */
#if defined(KWSYS_TERMINAL_SUPPORT_CONSOLE)
  if(pipeIsConsole)
    {
    kwsysTerminalSetConsoleColor(hOut, &hOutInfo, stream,
                                 kwsysTerminal_Color_Normal);
    }
#endif
  if(pipeIsVT100)
    {
    kwsysTerminalSetVT100Color(stream, kwsysTerminal_Color_Normal);
    }
}